

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuttonChenAdapter.cpp
# Opt level: O3

SCAtypeParameters * __thiscall
OpenMD::SuttonChenAdapter::getSuttonChenParam
          (SCAtypeParameters *__return_storage_ptr__,SuttonChenAdapter *this)

{
  RealType RVar1;
  RealType RVar2;
  RealType RVar3;
  bool bVar4;
  long lVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  shared_ptr<OpenMD::GenericData> data;
  undefined1 local_50 [16];
  string local_40;
  
  bVar4 = AtomType::hasProperty(this->at_,(string *)SCtypeID_abi_cxx11_);
  if (!bVar4) {
    AtomType::getName_abi_cxx11_(&local_40,this->at_);
    snprintf(painCave.errMsg,2000,
             "SuttonChenAdapter::getSuttonChenParam was passed an atomType (%s)\n\tthat does not appear to be a Sutton-Chen atom.\n"
             ,local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)local_50,(string *)this->at_);
  if ((_func_int **)local_50._0_8_ == (_func_int **)0x0) {
    AtomType::getName_abi_cxx11_(&local_40,this->at_);
    snprintf(painCave.errMsg,2000,
             "SuttonChenAdapter::getSuttonChenParam could not find Sutton-Chen\n\tparameters for atomType %s.\n"
             ,local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    if ((_func_int **)local_50._0_8_ != (_func_int **)0x0) goto LAB_0028f960;
LAB_0028f9a0:
    AtomType::getName_abi_cxx11_(&local_40,this->at_);
    snprintf(painCave.errMsg,2000,
             "SuttonChenAdapter::getSuttonChenParam could not convert\n\tGenericData to SCAtypeData for atom type %s\n"
             ,local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    __return_storage_ptr__->epsilon = _DAT_00000048;
    uVar6 = _DAT_00000028;
    uVar7 = uRam000000000000002c;
    uVar8 = uRam0000000000000030;
    uVar9 = uRam0000000000000034;
    uVar10 = _DAT_00000038;
    uVar11 = uRam000000000000003c;
    uVar12 = uRam0000000000000040;
    uVar13 = uRam0000000000000044;
  }
  else {
LAB_0028f960:
    lVar5 = __dynamic_cast(local_50._0_8_,&GenericData::typeinfo,
                           &SimpleTypeData<OpenMD::SCAtypeParameters>::typeinfo,0);
    if (lVar5 == 0) goto LAB_0028f9a0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_50._8_8_ + 8) = *(_Atomic_word *)(local_50._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_50._8_8_ + 8) = *(_Atomic_word *)(local_50._8_8_ + 8) + 1;
      }
      __return_storage_ptr__->epsilon = *(RealType *)(lVar5 + 0x48);
      RVar1 = *(RealType *)(lVar5 + 0x28);
      RVar2 = *(RealType *)(lVar5 + 0x30);
      RVar3 = *(RealType *)(lVar5 + 0x40);
      __return_storage_ptr__->n = *(RealType *)(lVar5 + 0x38);
      __return_storage_ptr__->alpha = RVar3;
      __return_storage_ptr__->c = RVar1;
      __return_storage_ptr__->m = RVar2;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
      goto LAB_0028fa56;
    }
    __return_storage_ptr__->epsilon = *(RealType *)(lVar5 + 0x48);
    uVar6 = *(undefined4 *)(lVar5 + 0x28);
    uVar7 = *(undefined4 *)(lVar5 + 0x2c);
    uVar8 = *(undefined4 *)(lVar5 + 0x30);
    uVar9 = *(undefined4 *)(lVar5 + 0x34);
    uVar10 = *(undefined4 *)(lVar5 + 0x38);
    uVar11 = *(undefined4 *)(lVar5 + 0x3c);
    uVar12 = *(undefined4 *)(lVar5 + 0x40);
    uVar13 = *(undefined4 *)(lVar5 + 0x44);
  }
  *(undefined4 *)&__return_storage_ptr__->n = uVar10;
  *(undefined4 *)((long)&__return_storage_ptr__->n + 4) = uVar11;
  *(undefined4 *)&__return_storage_ptr__->alpha = uVar12;
  *(undefined4 *)((long)&__return_storage_ptr__->alpha + 4) = uVar13;
  *(undefined4 *)&__return_storage_ptr__->c = uVar6;
  *(undefined4 *)((long)&__return_storage_ptr__->c + 4) = uVar7;
  *(undefined4 *)&__return_storage_ptr__->m = uVar8;
  *(undefined4 *)((long)&__return_storage_ptr__->m + 4) = uVar9;
LAB_0028fa56:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

SCAtypeParameters SuttonChenAdapter::getSuttonChenParam() {
    if (!isSuttonChen()) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "SuttonChenAdapter::getSuttonChenParam was passed an atomType (%s)\n"
          "\tthat does not appear to be a Sutton-Chen atom.\n",
          at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(SCtypeID);
    if (data == nullptr) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "SuttonChenAdapter::getSuttonChenParam could not find Sutton-Chen\n"
          "\tparameters for atomType %s.\n",
          at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<SCAtypeData> scData =
        std::dynamic_pointer_cast<SCAtypeData>(data);
    if (scData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SuttonChenAdapter::getSuttonChenParam could not convert\n"
               "\tGenericData to SCAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return scData->getData();
  }